

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O1

longlong TestConstExpr::ConstConstructor<long_long>(void)

{
  longlong ret;
  longlong local_40;
  longlong local_38 [3];
  longlong local_20;
  
  local_38[1] = 0;
  local_38[0] = 0;
  local_40 = 1;
  AdditionHelper<long_long,long_long,10>::
  AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (local_38 + 1,&local_40,local_38);
  local_38[2] = local_38[0];
  local_38[0] = 0;
  local_40 = 0;
  AdditionHelper<long_long,long_long,10>::
  AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (local_38 + 2,&local_40,local_38);
  local_20 = local_38[0];
  local_38[0] = 0;
  local_40 = 3;
  AdditionHelper<long_long,long_long,10>::
  AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_20,&local_40,local_38);
  return local_38[0];
}

Assistant:

SAFEINT_CONSTEXPR11 T ConstConstructor()
	{
		// Constructors, also add in the useless unary + operator
		return SafeInt<T>() + SafeInt<T>(1) + SafeInt<T>(false) + (+SafeInt<T>(3));
	}